

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall cfd::core::ScriptHash::ScriptHash(ScriptHash *this,Script *script,bool is_witness)

{
  undefined7 in_register_00000011;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ByteData256 hash256;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  this->_vptr_ScriptHash = (_func_int **)&PTR__ScriptHash_00654570;
  ByteData::ByteData(&this->script_hash_);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,is_witness) == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
               &(script->script_data_).data_);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                       (ByteData *)&local_60);
    HashUtil::Hash160((ByteData160 *)&local_30,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ByteData160::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
               (ByteData160 *)&local_30);
    local_60._M_impl.super__Vector_impl_data._M_start._0_1_ =
         (vector<unsigned_char,_std::allocator<unsigned_char>_>)0xa9;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(uchar *)&local_60
              );
    local_60._M_impl.super__Vector_impl_data._M_start._0_1_ =
         (vector<unsigned_char,_std::allocator<unsigned_char>_>)
         ((char)local_78._M_impl.super__Vector_impl_data._M_finish._0_4_ -
         (char)local_78._M_impl.super__Vector_impl_data._M_start._0_4_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(uchar *)&local_60
              );
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_78._M_impl.super__Vector_impl_data._M_start._0_4_),
               (uchar *)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_78._M_impl.super__Vector_impl_data._M_finish._0_4_),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    local_60._M_impl.super__Vector_impl_data._M_start._0_1_ =
         (vector<unsigned_char,_std::allocator<unsigned_char>_>)0x87;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(uchar *)&local_60
              );
  }
  else {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
               &(script->script_data_).data_);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                       (ByteData *)&local_60);
    HashUtil::Sha256((ByteData256 *)&local_30,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ByteData256::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
               (ByteData256 *)&local_30);
    local_60._M_impl.super__Vector_impl_data._M_start._0_1_ =
         (vector<unsigned_char,_std::allocator<unsigned_char>_>)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(uchar *)&local_60
              );
    local_60._M_impl.super__Vector_impl_data._M_start._0_1_ =
         (vector<unsigned_char,_std::allocator<unsigned_char>_>)
         ((char)local_78._M_impl.super__Vector_impl_data._M_finish._0_4_ -
         (char)local_78._M_impl.super__Vector_impl_data._M_start._0_4_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(uchar *)&local_60
              );
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_78._M_impl.super__Vector_impl_data._M_start._0_4_),
               (uchar *)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_78._M_impl.super__Vector_impl_data._M_finish._0_4_),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  ByteData::ByteData((ByteData *)&local_30,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->script_hash_,&local_30)
  ;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

ScriptHash::ScriptHash(const Script& script, bool is_witness)
    : script_hash_() {
  std::vector<uint8_t> buffer;
  buffer.clear();

  // hash calculation
  if (is_witness) {
    ByteData256 hash256 = HashUtil::Sha256(script.GetData().GetBytes());
    const std::vector<uint8_t> byte_array = hash256.GetBytes();
    // scriptPubKey : 0 <32-byte-hash>(0x0020{32-byte-hash})
    buffer.push_back(kOp_0);
    buffer.push_back(static_cast<uint8_t>(byte_array.size()));
    std::copy(
        byte_array.begin(), byte_array.end(), std::back_inserter(buffer));

  } else {
    ByteData160 hash160 = HashUtil::Hash160(script.GetData().GetBytes());
    const std::vector<uint8_t> byte_array = hash160.GetBytes();
    // Pubkey script   : OP_HASH160 <Hash160(redeemScript)> OP_EQUAL
    buffer.push_back(kOpHash160);
    buffer.push_back(static_cast<uint8_t>(byte_array.size()));
    std::copy(
        byte_array.begin(), byte_array.end(), std::back_inserter(buffer));
    buffer.push_back(kOpEqual);
  }

  script_hash_ = ByteData(buffer);
}